

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoeffBasedProduct.h
# Opt level: O0

Scalar __thiscall
Eigen::
CoeffBasedProduct<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_&,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_6>
::coeff(CoeffBasedProduct<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_&,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_6>
        *this,Index row,Index col)

{
  Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_RDX;
  Matrix<double,_3,_3,_0,_3,_3> *in_RSI;
  Index in_RDI;
  Index unaff_retaddr;
  Scalar res;
  double *in_stack_ffffffffffffffe0;
  
  internal::
  product_coeff_impl<0,_3,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_double>
  ::run(unaff_retaddr,in_RDI,in_RSI,in_RDX,in_stack_ffffffffffffffe0);
  return (Scalar)in_stack_ffffffffffffffe0;
}

Assistant:

EIGEN_STRONG_INLINE const Scalar coeff(Index row, Index col) const
    {
      Scalar res;
      ScalarCoeffImpl::run(row, col, m_lhs, m_rhs, res);
      return res;
    }